

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O1

int32_t icu_63::CollationFastLatin::compareUTF16
                  (uint16_t *table,uint16_t *primaries,int32_t options,UChar *left,
                  int32_t leftLength,UChar *right,int32_t rightLength)

{
  uint16_t *table_00;
  UChar UVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int32_t *piVar9;
  uint variableTop;
  ulong uVar10;
  ulong uVar11;
  uint32_t uVar12;
  bool bVar13;
  bool bVar14;
  int32_t leftIndex;
  int32_t local_60;
  int32_t local_5c;
  int32_t *local_58;
  int local_4c;
  uint local_48;
  uint local_44;
  UChar *local_40;
  uint local_34;
  
  table_00 = table + (byte)*table;
  variableTop = (uint)options >> 0x10;
  local_34 = options & 0xffff;
  uVar12 = 0;
  local_5c = 0;
  local_58 = &local_60;
  local_60 = 0;
  uVar4 = 0;
  local_4c = leftLength;
  local_48 = options;
  local_40 = right;
LAB_00236b32:
  do {
    if (uVar4 == 0) {
      lVar7 = (long)local_5c;
      if (local_5c == local_4c) {
        uVar4 = 2;
      }
      else {
        local_5c = local_5c + 1;
        UVar1 = left[lVar7];
        uVar11 = (ulong)(ushort)UVar1;
        if ((ushort)UVar1 < 0x180) {
          uVar4 = (uint32_t)primaries[uVar11];
          if (primaries[uVar11] == 0) {
            if (((local_48 & 2) == 0) || ((ushort)(UVar1 + L'ￆ') < 0xfff6)) {
              uVar3 = (uint)table_00[uVar11];
              goto LAB_00236bda;
            }
            local_58 = (int32_t *)0xfffffffe;
            uVar2 = 1;
            uVar4 = 0;
            goto LAB_00236bf9;
          }
LAB_00236bf4:
          uVar2 = 5;
        }
        else {
          if (((UVar1 & 0xffc0U) == 0x2000) || (((ushort)UVar1 & 0xffffffc0) == 0x2000)) {
            uVar3 = (uint)table_00[uVar11 - 0x1e80];
          }
          else {
            uVar3 = 1;
            if (uVar11 == 0xffff) {
              uVar3 = 0xfca8;
            }
            if (uVar11 == 0xfffe) {
              uVar3 = 3;
            }
          }
LAB_00236bda:
          if (0xfff < uVar3) {
            uVar4 = uVar3 & 0xfc00;
            goto LAB_00236bf4;
          }
          if (variableTop < uVar3) {
            uVar4 = uVar3 & 0xff8;
            goto LAB_00236bf4;
          }
          uVar4 = nextPair(table_00,(uint)(ushort)UVar1,uVar3,left,(uint8_t *)0x0,&local_5c,
                           &local_4c);
          if (uVar4 == 1) {
            local_58 = (int32_t *)0xfffffffe;
            uVar2 = 1;
            uVar4 = 1;
          }
          else {
            uVar3 = uVar4 & 0xffff;
            if (uVar3 < 0x1000) {
              if (uVar3 <= variableTop) {
                uVar2 = 0;
                if (0xbff < uVar3) {
                  uVar4 = uVar2;
                }
                goto LAB_00236bf9;
              }
              uVar4 = uVar4 & 0xfff8fff8;
            }
            else {
              uVar4 = uVar4 & 0xfc00fc00;
            }
            uVar2 = 0;
          }
        }
LAB_00236bf9:
        if (uVar2 == 0) goto LAB_00236b32;
        if (uVar2 != 5) goto LAB_00237585;
      }
    }
    do {
      if (uVar12 != 0) goto LAB_00236de3;
      lVar7 = (long)local_60;
      if (local_60 == rightLength) {
        uVar12 = 2;
        goto LAB_00236de3;
      }
      local_60 = local_60 + 1;
      UVar1 = local_40[lVar7];
      uVar11 = (ulong)(ushort)UVar1;
      uVar3 = (uint)(ushort)UVar1;
      if (uVar3 < 0x180) {
        uVar12 = (uint32_t)primaries[uVar11];
        if (primaries[uVar11] == 0) {
          if (((local_48 & 2) == 0) || ((ushort)(UVar1 + L'ￆ') < 0xfff6)) {
            uVar5 = (uint)table_00[uVar11];
            goto LAB_00236da3;
          }
          local_58 = (int32_t *)0xfffffffe;
          uVar2 = 1;
          uVar12 = 0;
          goto LAB_00236dca;
        }
LAB_00236dc5:
        uVar2 = 7;
      }
      else {
        if (((uVar3 & 0xffffffc0) == 0x2000) || ((uVar3 & 0xffffffc0) == 0x2000)) {
          uVar5 = (uint)table_00[uVar11 - 0x1e80];
        }
        else {
          uVar5 = 1;
          if (uVar11 == 0xffff) {
            uVar5 = 0xfca8;
          }
          if (uVar11 == 0xfffe) {
            uVar5 = 3;
          }
        }
LAB_00236da3:
        if (0xfff < uVar5) {
          uVar12 = uVar5 & 0xfc00;
          goto LAB_00236dc5;
        }
        if (variableTop < uVar5) {
          uVar12 = uVar5 & 0xff8;
          goto LAB_00236dc5;
        }
        uVar12 = nextPair(table_00,uVar3,uVar5,local_40,(uint8_t *)0x0,&local_60,&rightLength);
        if (uVar12 == 1) {
          local_58 = (int32_t *)0xfffffffe;
          uVar2 = 1;
          uVar12 = 1;
        }
        else {
          uVar3 = uVar12 & 0xffff;
          if (uVar3 < 0x1000) {
            if (uVar3 <= variableTop) {
              uVar2 = 0;
              if (0xbff < uVar3) {
                uVar12 = uVar2;
              }
              goto LAB_00236dca;
            }
            uVar12 = uVar12 & 0xfff8fff8;
          }
          else {
            uVar12 = uVar12 & 0xfc00fc00;
          }
          uVar2 = 0;
        }
      }
LAB_00236dca:
    } while (uVar2 == 0);
    if (uVar2 != 7) goto LAB_00237585;
LAB_00236de3:
    if (uVar4 != uVar12) {
      if ((uVar4 & 0xffff) == (uVar12 & 0xffff)) {
        iVar8 = 2;
        if (uVar4 == 2) {
          uVar4 = 2;
        }
        else {
          uVar4 = uVar4 >> 0x10;
          uVar12 = uVar12 >> 0x10;
          iVar8 = 0;
        }
      }
      else {
        local_58 = (int32_t *)(ulong)(-(uint)((uVar4 & 0xffff) < (uVar12 & 0xffff)) | 1);
        iVar8 = 1;
      }
      if (iVar8 != 0) {
        if (iVar8 != 2) goto LAB_00237585;
        break;
      }
      goto LAB_00236b32;
    }
    uVar12 = 0;
    bVar13 = uVar4 != 2;
    uVar4 = 0;
  } while (bVar13);
  if (0xfff < local_34) {
    uVar12 = 0;
    local_60 = 0;
    local_5c = 0;
    uVar4 = 0;
LAB_00236e9b:
    do {
      if (uVar4 == 0) {
        lVar7 = (long)local_5c;
        if (local_5c == local_4c) {
          uVar4 = 2;
        }
        else {
          local_5c = local_5c + 1;
          UVar1 = left[lVar7];
          uVar3 = (uint)(ushort)UVar1;
          if ((ushort)UVar1 < 0x180) {
            uVar5 = (uint)table_00[(ushort)UVar1];
          }
          else if ((UVar1 & 0xffc0U) == 0x2000) {
            uVar5 = (uint)table_00[(ulong)(ushort)UVar1 - 0x1e80];
          }
          else if ((UVar1 & 0xffc0U) == 0x2000) {
            uVar5 = (uint)table_00[(ulong)(ushort)UVar1 - 0x1e80];
          }
          else {
            uVar5 = 1;
            if (uVar3 == 0xffff) {
              uVar5 = 0xfca8;
            }
            if (uVar3 == 0xfffe) {
              uVar5 = 3;
            }
          }
          if (uVar5 < 0x1000) {
            if (variableTop < uVar5) {
              uVar4 = 0xc0;
              goto LAB_00236f4e;
            }
            uVar4 = nextPair(table_00,uVar3,uVar5,left,(uint8_t *)0x0,&local_5c,&local_4c);
            uVar4 = getSecondaries(variableTop,uVar4);
            bVar13 = true;
          }
          else {
            uVar5 = uVar5 & 0x3e0;
            uVar4 = uVar5 * 0x10000 + 0x2000c0;
            if (uVar5 < 0x180) {
              uVar4 = uVar5 + 0x20;
            }
LAB_00236f4e:
            bVar13 = false;
          }
          if (bVar13) goto LAB_00236e9b;
        }
      }
      do {
        if (uVar12 != 0) break;
        lVar7 = (long)local_60;
        if (local_60 == rightLength) {
          uVar12 = 2;
          break;
        }
        local_60 = local_60 + 1;
        UVar1 = local_40[lVar7];
        uVar3 = (uint)(ushort)UVar1;
        if ((ushort)UVar1 < 0x180) {
          uVar5 = (uint)table_00[(ushort)UVar1];
        }
        else if ((UVar1 & 0xffc0U) == 0x2000) {
          uVar5 = (uint)table_00[(ulong)(ushort)UVar1 - 0x1e80];
        }
        else if ((UVar1 & 0xffc0U) == 0x2000) {
          uVar5 = (uint)table_00[(ulong)(ushort)UVar1 - 0x1e80];
        }
        else {
          uVar5 = 1;
          if (uVar3 == 0xffff) {
            uVar5 = 0xfca8;
          }
          if (uVar3 == 0xfffe) {
            uVar5 = 3;
          }
        }
        if (uVar5 < 0x1000) {
          if (variableTop < uVar5) {
            uVar12 = 0xc0;
            goto LAB_00237045;
          }
          uVar12 = nextPair(table_00,uVar3,uVar5,local_40,(uint8_t *)0x0,&local_60,&rightLength);
          uVar12 = getSecondaries(variableTop,uVar12);
          bVar13 = true;
        }
        else {
          uVar5 = uVar5 & 0x3e0;
          uVar12 = uVar5 * 0x10000 + 0x2000c0;
          if (uVar5 < 0x180) {
            uVar12 = uVar5 + 0x20;
          }
LAB_00237045:
          bVar13 = false;
        }
      } while (bVar13);
      if (uVar4 != uVar12) {
        if ((uVar4 & 0xffff) == (uVar12 & 0xffff)) {
          if (uVar4 == 2) {
            uVar4 = 2;
            iVar8 = 8;
          }
          else {
            uVar4 = uVar4 >> 0x10;
            uVar12 = uVar12 >> 0x10;
            iVar8 = 0;
          }
        }
        else {
          local_58 = (int32_t *)0xfffffffe;
          iVar8 = 1;
          if ((local_48 >> 0xb & 1) == 0) {
            local_58 = (int32_t *)(ulong)(-(uint)((uVar4 & 0xffff) < (uVar12 & 0xffff)) | 1);
          }
        }
        if (iVar8 != 0) {
          if (iVar8 != 8) goto LAB_00237585;
          break;
        }
        goto LAB_00236e9b;
      }
      uVar12 = 0;
      bVar13 = uVar4 != 2;
      uVar4 = 0;
    } while (bVar13);
  }
  if ((local_48 >> 10 & 1) == 0) {
    local_44 = (uint)local_58;
  }
  else {
    bVar13 = local_34 < 0x1000;
    uVar11 = 0;
    local_60 = 0;
    local_5c = 0;
    uVar12 = 0;
joined_r0x00237132:
    do {
      if (uVar12 == 0) {
        lVar7 = (long)local_5c;
        if (local_5c != local_4c) {
          local_5c = local_5c + 1;
          UVar1 = left[lVar7];
          uVar10 = (ulong)(ushort)UVar1;
          if ((ushort)UVar1 < 0x180) {
            uVar3 = (uint)table_00[uVar10];
          }
          else if ((UVar1 & 0xffc0U) == 0x2000) {
            uVar3 = (uint)table_00[(ulong)(uint)(ushort)UVar1 - 0x1e80];
          }
          else {
            uVar3 = 1;
            if (uVar10 == 0xffff) {
              uVar3 = 0xfca8;
            }
            if (uVar10 == 0xfffe) {
              uVar3 = 3;
            }
          }
          if (uVar3 < 0xc00) {
            uVar3 = nextPair(table_00,(uint)(ushort)UVar1,uVar3,left,(uint8_t *)0x0,&local_5c,
                             &local_4c);
          }
          uVar12 = getCases(variableTop,bVar13,uVar3);
          goto joined_r0x00237132;
        }
        uVar12 = 2;
      }
      if ((int)uVar11 == 0) {
        do {
          lVar7 = (long)local_60;
          if (local_60 == rightLength) {
            uVar11 = 2;
            goto LAB_00237297;
          }
          local_60 = local_60 + 1;
          UVar1 = local_40[lVar7];
          uVar11 = (ulong)(ushort)UVar1;
          if ((ushort)UVar1 < 0x180) {
            uVar3 = (uint)table_00[uVar11];
          }
          else if ((UVar1 & 0xffc0U) == 0x2000) {
            uVar3 = (uint)table_00[(ulong)(uint)(ushort)UVar1 - 0x1e80];
          }
          else {
            uVar3 = 1;
            if (uVar11 == 0xffff) {
              uVar3 = 0xfca8;
            }
            if (uVar11 == 0xfffe) {
              uVar3 = 3;
            }
          }
          if (uVar3 < 0xc00) {
            uVar3 = nextPair(table_00,(uint)(ushort)UVar1,uVar3,local_40,(uint8_t *)0x0,&local_60,
                             &rightLength);
          }
          uVar4 = getCases(variableTop,bVar13,uVar3);
        } while (uVar4 == 0);
        uVar11 = (ulong)uVar4;
      }
LAB_00237297:
      if (uVar12 != (uint)uVar11) {
        uVar3 = uVar12 & 0xffff;
        uVar5 = (uint)uVar11 & 0xffff;
        if (uVar3 == uVar5) {
          iVar8 = 0;
          if (uVar12 == 2) {
            uVar12 = 2;
            iVar8 = 0xe;
            bVar14 = false;
          }
          else {
            uVar12 = uVar12 >> 0x10;
            uVar11 = uVar11 >> 0x10;
            bVar14 = true;
          }
        }
        else {
          if ((local_48 >> 8 & 1) == 0) {
            uVar3 = -(uint)(uVar3 < uVar5);
          }
          else {
            uVar3 = (uVar3 < uVar5) - 1;
          }
          bVar14 = false;
          local_58 = (int32_t *)(ulong)(uVar3 | 1);
          iVar8 = 1;
        }
        if (iVar8 != 0) {
          if (iVar8 != 0xe) goto LAB_00237324;
          break;
        }
        goto joined_r0x00237132;
      }
      uVar11 = 0;
      bVar14 = uVar12 != 2;
      uVar12 = 0;
    } while (bVar14);
    bVar14 = true;
LAB_00237324:
    local_44 = (uint)local_58;
    if (!bVar14) goto LAB_00237585;
  }
  if (0x1fff < local_34) {
    bVar13 = (local_48 & 0x600) == 0x200;
    uVar4 = 0;
    local_60 = 0;
    local_5c = 0;
    local_48 = local_48 & 0x700;
    uVar12 = 0;
joined_r0x0023737b:
    do {
      if (uVar12 == 0) {
        lVar7 = (long)local_5c;
        if (local_5c != local_4c) {
          local_5c = local_5c + 1;
          UVar1 = left[lVar7];
          uVar11 = (ulong)(ushort)UVar1;
          if ((ushort)UVar1 < 0x180) {
            uVar3 = (uint)table_00[uVar11];
          }
          else if ((UVar1 & 0xffc0U) == 0x2000) {
            uVar3 = (uint)table_00[(ulong)(uint)(ushort)UVar1 - 0x1e80];
          }
          else {
            uVar3 = 1;
            if (uVar11 == 0xffff) {
              uVar3 = 0xfca8;
            }
            if (uVar11 == 0xfffe) {
              uVar3 = 3;
            }
          }
          if (uVar3 < 0xc00) {
            uVar3 = nextPair(table_00,(uint)(ushort)UVar1,uVar3,left,(uint8_t *)0x0,&local_5c,
                             &local_4c);
          }
          uVar12 = getTertiaries(variableTop,bVar13,uVar3);
          goto joined_r0x0023737b;
        }
        uVar12 = 2;
      }
      while (uVar4 == 0) {
        lVar7 = (long)local_60;
        if (local_60 == rightLength) {
          uVar4 = 2;
          break;
        }
        local_60 = local_60 + 1;
        UVar1 = local_40[lVar7];
        uVar11 = (ulong)(ushort)UVar1;
        if ((ushort)UVar1 < 0x180) {
          uVar3 = (uint)table_00[uVar11];
        }
        else if ((UVar1 & 0xffc0U) == 0x2000) {
          uVar3 = (uint)table_00[(ulong)(uint)(ushort)UVar1 - 0x1e80];
        }
        else {
          uVar3 = 1;
          if (uVar11 == 0xffff) {
            uVar3 = 0xfca8;
          }
          if (uVar11 == 0xfffe) {
            uVar3 = 3;
          }
        }
        if (uVar3 < 0xc00) {
          uVar3 = nextPair(table_00,(uint)(ushort)UVar1,uVar3,local_40,(uint8_t *)0x0,&local_60,
                           &rightLength);
        }
        uVar4 = getTertiaries(variableTop,bVar13,uVar3);
      }
      if (uVar12 != uVar4) {
        uVar3 = uVar12 & 0xffff;
        uVar5 = uVar4 & 0xffff;
        if (uVar3 == uVar5) {
          if (uVar12 == 2) {
            uVar12 = 2;
            iVar8 = 0x14;
          }
          else {
            uVar12 = uVar12 >> 0x10;
            uVar4 = uVar4 >> 0x10;
            iVar8 = 0;
          }
        }
        else {
          if (local_48 == 0x300) {
            if (3 < uVar3) {
              uVar3 = uVar3 ^ 0x18;
            }
            if (3 < uVar5) {
              uVar5 = uVar5 ^ 0x18;
            }
          }
          local_44 = -(uint)(uVar3 < uVar5) | 1;
          iVar8 = 1;
        }
        if (iVar8 != 0) {
          if (iVar8 != 0x14) {
            local_58 = (int32_t *)(ulong)local_44;
            goto LAB_00237585;
          }
          break;
        }
        goto joined_r0x0023737b;
      }
      uVar4 = 0;
      bVar14 = uVar12 != 2;
      uVar12 = 0;
    } while (bVar14);
    if (0x2fff < local_34) {
      local_60 = 0;
      local_58 = (int32_t *)0x0;
      local_5c = 0;
      uVar3 = 0;
LAB_002375bc:
      do {
        piVar9 = local_58;
        if (uVar3 == 0) {
          lVar7 = (long)local_5c;
          if (local_5c != local_4c) {
            local_5c = local_5c + 1;
            UVar1 = left[lVar7];
            uVar11 = (ulong)(ushort)UVar1;
            if ((ushort)UVar1 < 0x180) {
              uVar5 = (uint)table_00[uVar11];
            }
            else if ((UVar1 & 0xffc0U) == 0x2000) {
              uVar5 = (uint)table_00[(ulong)(uint)(ushort)UVar1 - 0x1e80];
            }
            else {
              uVar5 = 1;
              if (uVar11 == 0xffff) {
                uVar5 = 0xfca8;
              }
              if (uVar11 == 0xfffe) {
                uVar5 = 3;
              }
            }
            if (uVar5 < 0xc00) {
              uVar5 = nextPair(table_00,(uint)(ushort)UVar1,uVar5,left,(uint8_t *)0x0,&local_5c,
                               &local_4c);
            }
            if (uVar5 < 0x10000) {
              if (uVar5 < 0x1000) {
                uVar3 = 0xfc00;
                if ((uVar5 <= variableTop) && (uVar3 = uVar5 & 0xff8, uVar5 < 0xc00)) {
                  uVar3 = uVar5;
                }
              }
              else {
                uVar3 = (uint)((uVar5 & 0x380) < 0x180) * 0x4000000 + 0xfc00fc00;
              }
            }
            else {
              uVar3 = uVar5 & 0xfff8fff8;
              if (variableTop < (uVar5 & 0xffff)) {
                uVar3 = 0xfc00fc00;
              }
            }
            goto LAB_002375bc;
          }
          uVar3 = 2;
        }
        while ((int)piVar9 == 0) {
          lVar7 = (long)local_60;
          if (local_60 == rightLength) {
            piVar9 = (int32_t *)0x2;
            break;
          }
          local_60 = local_60 + 1;
          UVar1 = local_40[lVar7];
          uVar11 = (ulong)(ushort)UVar1;
          if ((ushort)UVar1 < 0x180) {
            uVar5 = (uint)table_00[uVar11];
          }
          else if ((UVar1 & 0xffc0U) == 0x2000) {
            uVar5 = (uint)table_00[(ulong)(uint)(ushort)UVar1 - 0x1e80];
          }
          else {
            uVar5 = 1;
            if (uVar11 == 0xffff) {
              uVar5 = 0xfca8;
            }
            if (uVar11 == 0xfffe) {
              uVar5 = 3;
            }
          }
          if (uVar5 < 0xc00) {
            uVar5 = nextPair(table_00,(uint)(ushort)UVar1,uVar5,local_40,(uint8_t *)0x0,&local_60,
                             &rightLength);
          }
          if (uVar5 < 0x10000) {
            if (uVar5 < 0x1000) {
              piVar9 = (int32_t *)0xfc00;
              if (uVar5 <= variableTop) {
                uVar6 = uVar5 & 0xff8;
                if (uVar5 < 0xc00) {
                  uVar6 = uVar5;
                }
                piVar9 = (int32_t *)(ulong)uVar6;
              }
            }
            else {
              piVar9 = (int32_t *)(ulong)((uint)((uVar5 & 0x380) < 0x180) * 0x4000000 + 0xfc00fc00);
            }
          }
          else {
            uVar6 = uVar5 & 0xfff8fff8;
            if (variableTop < (uVar5 & 0xffff)) {
              uVar6 = 0xfc00fc00;
            }
            piVar9 = (int32_t *)(ulong)uVar6;
          }
        }
        if (uVar3 != (uint)piVar9) {
          uVar5 = (uint)piVar9 & 0xffff;
          local_58 = piVar9;
          if ((uVar3 & 0xffff) == uVar5) {
            if (uVar3 == 2) {
              uVar3 = 2;
              iVar8 = 0x1a;
            }
            else {
              uVar3 = uVar3 >> 0x10;
              iVar8 = 0;
              local_58 = (int32_t *)((ulong)piVar9 >> 0x10 & 0xffff);
            }
          }
          else {
            local_44 = -(uint)((uVar3 & 0xffff) < uVar5) | 1;
            iVar8 = 1;
          }
          if (iVar8 != 0) {
            local_58 = (int32_t *)(ulong)local_44;
            if (iVar8 == 0x1a) goto LAB_0023757c;
            break;
          }
          goto LAB_002375bc;
        }
        local_58 = (int32_t *)0x0;
        bVar13 = uVar3 != 2;
        uVar3 = 0;
      } while (bVar13);
      goto LAB_00237585;
    }
  }
LAB_0023757c:
  local_58 = (int32_t *)0x0;
LAB_00237585:
  return (int32_t)local_58;
}

Assistant:

int32_t
CollationFastLatin::compareUTF16(const uint16_t *table, const uint16_t *primaries, int32_t options,
                                 const UChar *left, int32_t leftLength,
                                 const UChar *right, int32_t rightLength) {
    // This is a modified copy of CollationCompare::compareUpToQuaternary(),
    // optimized for common Latin text.
    // Keep them in sync!
    // Keep compareUTF16() and compareUTF8() in sync very closely!

    U_ASSERT((table[0] >> 8) == VERSION);
    table += (table[0] & 0xff);  // skip the header
    uint32_t variableTop = (uint32_t)options >> 16;  // see getOptions()
    options &= 0xffff;  // needed for CollationSettings::getStrength() to work

    // Check for supported characters, fetch mini CEs, and compare primaries.
    int32_t leftIndex = 0, rightIndex = 0;
    /**
     * Single mini CE or a pair.
     * The current mini CE is in the lower 16 bits, the next one is in the upper 16 bits.
     * If there is only one, then it is in the lower bits, and the upper bits are 0.
     */
    uint32_t leftPair = 0, rightPair = 0;
    for(;;) {
        // We fetch CEs until we get a non-ignorable primary or reach the end.
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            if(c <= LATIN_MAX) {
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                leftPair = table[c];
            } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                leftPair = table[c - PUNCT_START + LATIN_LIMIT];
            } else {
                leftPair = lookup(table, c);
            }
            if(leftPair >= MIN_SHORT) {
                leftPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(leftPair > variableTop) {
                leftPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                if(leftPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                leftPair = getPrimaries(variableTop, leftPair);
            }
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            if(c <= LATIN_MAX) {
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                rightPair = table[c];
            } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                rightPair = table[c - PUNCT_START + LATIN_LIMIT];
            } else {
                rightPair = lookup(table, c);
            }
            if(rightPair >= MIN_SHORT) {
                rightPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(rightPair > variableTop) {
                rightPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                if(rightPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                rightPair = getPrimaries(variableTop, rightPair);
            }
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftPrimary = leftPair & 0xffff;
        uint32_t rightPrimary = rightPair & 0xffff;
        if(leftPrimary != rightPrimary) {
            // Return the primary difference.
            return (leftPrimary < rightPrimary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    // In the following, we need to re-fetch each character because we did not buffer the CEs,
    // but we know that the string is well-formed and
    // only contains supported characters and mappings.

    // We might skip the secondary level but continue with the case level
    // which is turned on separately.
    if(CollationSettings::getStrength(options) >= UCOL_SECONDARY) {
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                if(c <= LATIN_MAX) {
                    leftPair = table[c];
                } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                    leftPair = table[c - PUNCT_START + LATIN_LIMIT];
                } else {
                    leftPair = lookup(table, c);
                }
                if(leftPair >= MIN_SHORT) {
                    leftPair = getSecondariesFromOneShortCE(leftPair);
                    break;
                } else if(leftPair > variableTop) {
                    leftPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                    leftPair = getSecondaries(variableTop, leftPair);
                }
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                if(c <= LATIN_MAX) {
                    rightPair = table[c];
                } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                    rightPair = table[c - PUNCT_START + LATIN_LIMIT];
                } else {
                    rightPair = lookup(table, c);
                }
                if(rightPair >= MIN_SHORT) {
                    rightPair = getSecondariesFromOneShortCE(rightPair);
                    break;
                } else if(rightPair > variableTop) {
                    rightPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                    rightPair = getSecondaries(variableTop, rightPair);
                }
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftSecondary = leftPair & 0xffff;
            uint32_t rightSecondary = rightPair & 0xffff;
            if(leftSecondary != rightSecondary) {
                if((options & CollationSettings::BACKWARD_SECONDARY) != 0) {
                    // Full support for backwards secondary requires backwards contraction matching
                    // and moving backwards between merge separators.
                    return BAIL_OUT_RESULT;
                }
                return (leftSecondary < rightSecondary) ? UCOL_LESS : UCOL_GREATER;
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }

    if((options & CollationSettings::CASE_LEVEL) != 0) {
        UBool strengthIsPrimary = CollationSettings::getStrength(options) == UCOL_PRIMARY;
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
                if(leftPair < MIN_LONG) {
                    leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                }
                leftPair = getCases(variableTop, strengthIsPrimary, leftPair);
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
                if(rightPair < MIN_LONG) {
                    rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                }
                rightPair = getCases(variableTop, strengthIsPrimary, rightPair);
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftCase = leftPair & 0xffff;
            uint32_t rightCase = rightPair & 0xffff;
            if(leftCase != rightCase) {
                if((options & CollationSettings::UPPER_FIRST) == 0) {
                    return (leftCase < rightCase) ? UCOL_LESS : UCOL_GREATER;
                } else {
                    return (leftCase < rightCase) ? UCOL_GREATER : UCOL_LESS;
                }
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }
    if(CollationSettings::getStrength(options) <= UCOL_SECONDARY) { return UCOL_EQUAL; }

    // Remove the case bits from the tertiary weight when caseLevel is on or caseFirst is off.
    UBool withCaseBits = CollationSettings::isTertiaryWithCaseBits(options);

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
            }
            leftPair = getTertiaries(variableTop, withCaseBits, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
            }
            rightPair = getTertiaries(variableTop, withCaseBits, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftTertiary = leftPair & 0xffff;
        uint32_t rightTertiary = rightPair & 0xffff;
        if(leftTertiary != rightTertiary) {
            if(CollationSettings::sortsTertiaryUpperCaseFirst(options)) {
                // Pass through EOS and MERGE_WEIGHT
                // and keep real tertiary weights larger than the MERGE_WEIGHT.
                // Tertiary CEs (secondary ignorables) are not supported in fast Latin.
                if(leftTertiary > MERGE_WEIGHT) {
                    leftTertiary ^= CASE_MASK;
                }
                if(rightTertiary > MERGE_WEIGHT) {
                    rightTertiary ^= CASE_MASK;
                }
            }
            return (leftTertiary < rightTertiary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    if(CollationSettings::getStrength(options) <= UCOL_TERTIARY) { return UCOL_EQUAL; }

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
            }
            leftPair = getQuaternaries(variableTop, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
            }
            rightPair = getQuaternaries(variableTop, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftQuaternary = leftPair & 0xffff;
        uint32_t rightQuaternary = rightPair & 0xffff;
        if(leftQuaternary != rightQuaternary) {
            return (leftQuaternary < rightQuaternary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    return UCOL_EQUAL;
}